

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void anon_unknown.dwarf_1d643::convert_planar_to_pixel<unsigned_char>
               (size_t width,size_t height,void *source,void *destination)

{
  long local_68;
  size_t offset;
  size_t column;
  size_t row;
  uchar *pixels;
  uchar *plane2;
  uchar *plane1;
  uchar *plane0;
  size_t stride_in_pixels;
  void *destination_local;
  void *source_local;
  size_t height_local;
  size_t width_local;
  
  plane2 = (uchar *)((long)source + width * height);
  pixels = (uchar *)((long)source + width * height * 2);
  row = (size_t)destination;
  plane1 = (uchar *)source;
  for (column = 0; column != height; column = column + 1) {
    local_68 = 0;
    for (offset = 0; offset != width; offset = offset + 1) {
      *(uchar *)(row + local_68) = plane1[offset];
      *(uchar *)(row + 1 + local_68) = plane2[offset];
      *(uchar *)(row + 2 + local_68) = pixels[offset];
      local_68 = local_68 + 3;
    }
    plane1 = plane1 + width;
    plane2 = plane2 + width;
    pixels = pixels + width;
    row = width * 3 + row;
  }
  return;
}

Assistant:

void convert_planar_to_pixel(const size_t width, const size_t height, const void* source, void* destination) noexcept
{
    const size_t stride_in_pixels{width * 3};
    const auto* plane0{static_cast<const SizeType*>(source)};
    const auto* plane1{static_cast<const SizeType*>(source) + (width * height)};
    const auto* plane2{static_cast<const SizeType*>(source) + (width * height * 2)};

    auto* pixels{static_cast<SizeType*>(destination)};

    for (size_t row{}; row != height; ++row)
    {
        for (size_t column{}, offset = 0; column != width; ++column, offset += 3)
        {
            pixels[offset + 0] = plane0[column];
            pixels[offset + 1] = plane1[column];
            pixels[offset + 2] = plane2[column];
        }

        plane0 += width;
        plane1 += width;
        plane2 += width;
        pixels += stride_in_pixels;
    }
}